

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Definition * __thiscall cppforth::Forth::definitionsAt(Forth *this,Cell index)

{
  reference pvVar1;
  allocator<char> local_39;
  string local_38;
  
  if ((ulong)(((long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->definitions).
                    super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x50) <= (ulong)index) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Access to definitions out of range",&local_39);
    throwCppExceptionMessage(this,&local_38,errorUndefinedWord);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pvVar1 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
           at(&this->definitions,(ulong)index);
  return pvVar1;
}

Assistant:

Definition &definitionsAt(Cell index){
			if (index >= definitions.size() || index<0){
				throwCppExceptionMessage("Access to definitions out of range",errorUndefinedWord);
			}
			return definitions.at(index);
		}